

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateAccessChain(ValidationState_t *_,Instruction *inst)

{
  ulong uVar1;
  bool bVar2;
  Op OVar3;
  uint32_t uVar4;
  uint uVar5;
  int32_t iVar6;
  uint32_t uVar7;
  char *__s;
  DiagnosticStream *pDVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar9;
  size_type sVar10;
  spv_const_validator_options psVar11;
  const_reference pvVar12;
  Instruction *local_1658;
  char *local_15f8;
  char *local_15f0;
  DiagnosticStream local_15e8;
  Instruction *local_1410;
  Instruction *result_type_pointee;
  uint32_t local_122c;
  size_t sStack_1228;
  uint32_t structMemberId;
  size_t word_index;
  string local_1218;
  DiagnosticStream local_11f8;
  long local_1020;
  int64_t num_struct_members;
  long local_e40;
  int64_t cur_index;
  Instruction *local_c60;
  Instruction *index_type;
  Instruction *cur_word_instr;
  ulong uStack_c48;
  uint32_t cur_word;
  size_t i;
  undefined1 local_c38 [4];
  int starting_index;
  ulong local_a60;
  size_t num_indexes_limit;
  size_t num_indexes;
  Instruction *type_pointee;
  uint32_t local_870;
  uint32_t local_86c;
  uint32_t base_type_storage_class;
  uint32_t result_type_storage_class;
  DiagnosticStream local_848;
  Instruction *local_670;
  Instruction *base_type;
  Instruction *base;
  uint base_id;
  int base_index;
  Instruction *local_480;
  Instruction *base_type_1;
  string local_470;
  DiagnosticStream local_450;
  undefined4 local_274;
  char *local_270;
  string local_268;
  DiagnosticStream local_248;
  Instruction *local_70;
  Instruction *result_type;
  undefined1 local_60 [6];
  bool untyped_pointer;
  undefined1 local_40 [8];
  string instr_name;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  instr_name.field_2._8_8_ = inst;
  OVar3 = Instruction::opcode(inst);
  __s = spvOpcodeString(OVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,__s,(allocator<char> *)((long)&result_type + 7));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,"Op",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::allocator<char>::~allocator((allocator<char> *)((long)&result_type + 7));
  OVar3 = Instruction::opcode((Instruction *)instr_name.field_2._8_8_);
  result_type._6_1_ = spvOpcodeGeneratesUntypedPointer(OVar3);
  uVar4 = Instruction::type_id((Instruction *)instr_name.field_2._8_8_);
  local_70 = ValidationState_t::FindDef(_,uVar4);
  if ((result_type._6_1_ & 1) == 0) {
    if ((local_70 == (Instruction *)0x0) ||
       (OVar3 = Instruction::opcode(local_70), OVar3 != OpTypePointer)) {
      ValidationState_t::diag
                (&local_450,_,SPV_ERROR_INVALID_ID,(Instruction *)instr_name.field_2._8_8_);
      pDVar8 = DiagnosticStream::operator<<(&local_450,(char (*) [20])"The Result Type of ");
      pDVar8 = DiagnosticStream::operator<<
                         (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_40);
      pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [7])0x62fc97);
      uVar4 = Instruction::id((Instruction *)instr_name.field_2._8_8_);
      ValidationState_t::getIdName_abi_cxx11_(&local_470,_,uVar4);
      pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_470);
      pDVar8 = DiagnosticStream::operator<<
                         (pDVar8,(char (*) [33])" must be OpTypePointer. Found Op");
      OVar3 = Instruction::opcode(local_70);
      base_type_1 = (Instruction *)spvOpcodeString(OVar3);
      pDVar8 = DiagnosticStream::operator<<(pDVar8,(char **)&base_type_1);
      pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [2])0x61bbfb);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      std::__cxx11::string::~string((string *)&local_470);
      DiagnosticStream::~DiagnosticStream(&local_450);
      goto LAB_00585624;
    }
  }
  else if ((local_70 == (Instruction *)0x0) ||
          (OVar3 = Instruction::opcode(local_70), OVar3 != OpTypeUntypedPointerKHR)) {
    ValidationState_t::diag
              (&local_248,_,SPV_ERROR_INVALID_ID,(Instruction *)instr_name.field_2._8_8_);
    pDVar8 = DiagnosticStream::operator<<(&local_248,(char (*) [20])"The Result Type of ");
    pDVar8 = DiagnosticStream::operator<<
                       (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_40);
    pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [7])0x62fc97);
    uVar4 = Instruction::id((Instruction *)instr_name.field_2._8_8_);
    ValidationState_t::getIdName_abi_cxx11_(&local_268,_,uVar4);
    pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_268);
    pDVar8 = DiagnosticStream::operator<<
                       (pDVar8,(char (*) [43])" must be OpTypeUntypedPointerKHR. Found Op");
    OVar3 = Instruction::opcode(local_70);
    local_270 = spvOpcodeString(OVar3);
    pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_270);
    pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [2])0x61bbfb);
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
    std::__cxx11::string::~string((string *)&local_268);
    DiagnosticStream::~DiagnosticStream(&local_248);
    goto LAB_00585624;
  }
  if ((result_type._6_1_ & 1) == 0) {
LAB_00584c1f:
    base._4_4_ = 2;
    if ((result_type._6_1_ & 1) != 0) {
      base._4_4_ = 3;
    }
    base._0_4_ = Instruction::GetOperandAs<unsigned_int>
                           ((Instruction *)instr_name.field_2._8_8_,(long)base._4_4_);
    base_type = ValidationState_t::FindDef(_,(uint)base);
    uVar4 = Instruction::type_id(base_type);
    local_670 = ValidationState_t::FindDef(_,uVar4);
    if ((local_670 == (Instruction *)0x0) ||
       ((OVar3 = Instruction::opcode(local_670), OVar3 != OpTypePointer &&
        (((result_type._6_1_ & 1) == 0 ||
         (OVar3 = Instruction::opcode(local_670), OVar3 != OpTypeUntypedPointerKHR)))))) {
      ValidationState_t::diag
                (&local_848,_,SPV_ERROR_INVALID_ID,(Instruction *)instr_name.field_2._8_8_);
      pDVar8 = DiagnosticStream::operator<<(&local_848,(char (*) [15])"The Base <id> ");
      ValidationState_t::getIdName_abi_cxx11_((string *)&base_type_storage_class,_,(uint)base);
      pDVar8 = DiagnosticStream::operator<<
                         (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&base_type_storage_class);
      pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [5])0x6358d6);
      pDVar8 = DiagnosticStream::operator<<
                         (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_40);
      pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [32])0x5f5bf6);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      std::__cxx11::string::~string((string *)&base_type_storage_class);
      DiagnosticStream::~DiagnosticStream(&local_848);
    }
    else {
      local_86c = Instruction::word(local_70,2);
      local_870 = Instruction::word(local_670,2);
      if (local_86c == local_870) {
        if ((result_type._6_1_ & 1) == 0) {
          uVar4 = Instruction::word(local_670,3);
          local_1658 = ValidationState_t::FindDef(_,uVar4);
        }
        else {
          uVar5 = Instruction::GetOperandAs<unsigned_int>((Instruction *)instr_name.field_2._8_8_,2)
          ;
          local_1658 = ValidationState_t::FindDef(_,uVar5);
        }
        num_indexes = (size_t)local_1658;
        pvVar9 = Instruction::words((Instruction *)instr_name.field_2._8_8_);
        sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar9);
        num_indexes_limit = sVar10 - 4;
        OVar3 = Instruction::opcode((Instruction *)instr_name.field_2._8_8_);
        if (((OVar3 == OpPtrAccessChain) ||
            (OVar3 = Instruction::opcode((Instruction *)instr_name.field_2._8_8_),
            OVar3 == OpInBoundsPtrAccessChain)) ||
           ((OVar3 = Instruction::opcode((Instruction *)instr_name.field_2._8_8_),
            OVar3 == OpUntypedPtrAccessChainKHR ||
            (OVar3 = Instruction::opcode((Instruction *)instr_name.field_2._8_8_),
            OVar3 == OpUntypedInBoundsPtrAccessChainKHR)))) {
          num_indexes_limit = num_indexes_limit - 1;
        }
        psVar11 = ValidationState_t::options(_);
        local_a60 = (ulong)(psVar11->universal_limits_).max_access_chain_indexes;
        if (local_a60 < num_indexes_limit) {
          ValidationState_t::diag
                    ((DiagnosticStream *)local_c38,_,SPV_ERROR_INVALID_ID,
                     (Instruction *)instr_name.field_2._8_8_);
          pDVar8 = DiagnosticStream::operator<<
                             ((DiagnosticStream *)local_c38,
                              (char (*) [26])"The number of indexes in ");
          pDVar8 = DiagnosticStream::operator<<
                             (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_40);
          pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [17])" may not exceed ");
          pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_a60);
          pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [9])0x6314f3);
          pDVar8 = DiagnosticStream::operator<<(pDVar8,&num_indexes_limit);
          pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [10])" indexes.");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_c38);
        }
        else {
          i._4_4_ = 4;
          if ((result_type._6_1_ & 1) != 0) {
            i._4_4_ = 5;
          }
          OVar3 = Instruction::opcode((Instruction *)instr_name.field_2._8_8_);
          if ((((OVar3 == OpPtrAccessChain) ||
               (OVar3 = Instruction::opcode((Instruction *)instr_name.field_2._8_8_),
               OVar3 == OpInBoundsPtrAccessChain)) ||
              (OVar3 = Instruction::opcode((Instruction *)instr_name.field_2._8_8_),
              OVar3 == OpUntypedPtrAccessChainKHR)) ||
             (OVar3 = Instruction::opcode((Instruction *)instr_name.field_2._8_8_),
             OVar3 == OpUntypedInBoundsPtrAccessChainKHR)) {
            i._4_4_ = i._4_4_ + 1;
          }
          uStack_c48 = (ulong)i._4_4_;
          while( true ) {
            uVar1 = uStack_c48;
            pvVar9 = Instruction::words((Instruction *)instr_name.field_2._8_8_);
            sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar9);
            if (sVar10 <= uVar1) break;
            pvVar9 = Instruction::words((Instruction *)instr_name.field_2._8_8_);
            pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (pvVar9,uStack_c48);
            cur_word_instr._4_4_ = *pvVar12;
            index_type = ValidationState_t::FindDef(_,cur_word_instr._4_4_);
            uVar4 = Instruction::type_id(index_type);
            local_c60 = ValidationState_t::FindDef(_,uVar4);
            if ((local_c60 == (Instruction *)0x0) ||
               (OVar3 = Instruction::opcode(local_c60), OVar3 != OpTypeInt)) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&cur_index,_,SPV_ERROR_INVALID_ID,
                         (Instruction *)instr_name.field_2._8_8_);
              pDVar8 = DiagnosticStream::operator<<
                                 ((DiagnosticStream *)&cur_index,(char (*) [19])"Indexes passed to "
                                 );
              pDVar8 = DiagnosticStream::operator<<
                                 (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_40);
              pDVar8 = DiagnosticStream::operator<<
                                 (pDVar8,(char (*) [26])" must be of type integer.");
              __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&cur_index);
              goto LAB_00585624;
            }
            OVar3 = Instruction::opcode((Instruction *)num_indexes);
            if ((OVar3 - OpTypeVector < 2) || (OVar3 - OpTypeArray < 2)) {
LAB_005851d6:
              uVar4 = Instruction::word((Instruction *)num_indexes,2);
              num_indexes = (size_t)ValidationState_t::FindDef(_,uVar4);
            }
            else {
              if (OVar3 != OpTypeStruct) {
                if ((OVar3 == OpTypeCooperativeMatrixKHR) || (OVar3 == OpTypeCooperativeMatrixNV))
                goto LAB_005851d6;
                ValidationState_t::diag
                          ((DiagnosticStream *)&result_type_pointee,_,SPV_ERROR_INVALID_ID,
                           (Instruction *)instr_name.field_2._8_8_);
                pDVar8 = DiagnosticStream::operator<<
                                   ((DiagnosticStream *)&result_type_pointee,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_40);
                pDVar8 = DiagnosticStream::operator<<
                                   (pDVar8,(char (*) [72])
                                           " reached non-composite type while indexes still remain to be traversed."
                                   );
                __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&result_type_pointee);
                goto LAB_00585624;
              }
              bVar2 = ValidationState_t::EvalConstantValInt64(_,cur_word_instr._4_4_,&local_e40);
              if (!bVar2) {
                ValidationState_t::diag
                          ((DiagnosticStream *)&num_struct_members,_,SPV_ERROR_INVALID_ID,index_type
                          );
                pDVar8 = DiagnosticStream::operator<<
                                   ((DiagnosticStream *)&num_struct_members,
                                    (char (*) [20])"The <id> passed to ");
                pDVar8 = DiagnosticStream::operator<<
                                   (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_40);
                pDVar8 = DiagnosticStream::operator<<
                                   (pDVar8,(char (*) [50])
                                           " to index into a structure must be an OpConstant.");
                __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&num_struct_members);
                goto LAB_00585624;
              }
              pvVar9 = Instruction::words((Instruction *)num_indexes);
              sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar9);
              local_1020 = sVar10 - 2;
              if ((local_1020 <= local_e40) || (local_e40 < 0)) {
                ValidationState_t::diag(&local_11f8,_,SPV_ERROR_INVALID_ID,index_type);
                pDVar8 = DiagnosticStream::operator<<
                                   (&local_11f8,(char (*) [25])"Index is out of bounds: ");
                pDVar8 = DiagnosticStream::operator<<
                                   (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_40);
                pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [20])" cannot find index ");
                pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_e40);
                pDVar8 = DiagnosticStream::operator<<
                                   (pDVar8,(char (*) [26])" into the structure <id> ");
                uVar4 = Instruction::id((Instruction *)num_indexes);
                ValidationState_t::getIdName_abi_cxx11_(&local_1218,_,uVar4);
                pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_1218);
                pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [22])0x624282);
                pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_1020);
                pDVar8 = DiagnosticStream::operator<<
                                   (pDVar8,(char (*) [34])" members. Largest valid index is ");
                word_index = local_1020 - 1;
                pDVar8 = DiagnosticStream::operator<<(pDVar8,(long *)&word_index);
                pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [2])0x61bbfb);
                __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
                std::__cxx11::string::~string((string *)&local_1218);
                DiagnosticStream::~DiagnosticStream(&local_11f8);
                goto LAB_00585624;
              }
              sStack_1228 = local_e40 + 2;
              local_122c = Instruction::word((Instruction *)num_indexes,sStack_1228);
              num_indexes = (size_t)ValidationState_t::FindDef(_,local_122c);
            }
            uStack_c48 = uStack_c48 + 1;
          }
          if ((result_type._6_1_ & 1) == 0) {
            uVar4 = Instruction::word(local_70,3);
            local_1410 = ValidationState_t::FindDef(_,uVar4);
            uVar4 = Instruction::id((Instruction *)num_indexes);
            uVar7 = Instruction::id(local_1410);
            if (uVar4 != uVar7) {
              ValidationState_t::diag
                        (&local_15e8,_,SPV_ERROR_INVALID_ID,(Instruction *)instr_name.field_2._8_8_)
              ;
              pDVar8 = DiagnosticStream::operator<<
                                 (&local_15e8,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40);
              pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [17])" result type (Op");
              OVar3 = Instruction::opcode(local_1410);
              local_15f0 = spvOpcodeString(OVar3);
              pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_15f0);
              pDVar8 = DiagnosticStream::operator<<
                                 (pDVar8,(char (*) [76])
                                         ") does not match the type that results from indexing into the base <id> (Op"
                                 );
              OVar3 = Instruction::opcode((Instruction *)num_indexes);
              local_15f8 = spvOpcodeString(OVar3);
              pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_15f8);
              pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [3])0x61cae8);
              __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
              DiagnosticStream::~DiagnosticStream(&local_15e8);
              goto LAB_00585624;
            }
          }
          __local._4_4_ = SPV_SUCCESS;
        }
      }
      else {
        ValidationState_t::diag
                  ((DiagnosticStream *)&type_pointee,_,SPV_ERROR_INVALID_ID,
                   (Instruction *)instr_name.field_2._8_8_);
        pDVar8 = DiagnosticStream::operator<<
                           ((DiagnosticStream *)&type_pointee,
                            (char (*) [68])
                            "The result pointer storage class and base pointer storage class in ");
        pDVar8 = DiagnosticStream::operator<<
                           (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_40);
        pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [15])" do not match.");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&type_pointee);
      }
    }
  }
  else {
    uVar5 = Instruction::GetOperandAs<unsigned_int>((Instruction *)instr_name.field_2._8_8_,2);
    local_480 = ValidationState_t::FindDef(_,uVar5);
    if (local_480 != (Instruction *)0x0) {
      OVar3 = Instruction::opcode(local_480);
      iVar6 = spvOpcodeGeneratesType(OVar3);
      if (((iVar6 != 0) && (OVar3 = Instruction::opcode(local_480), OVar3 != OpTypePointer)) &&
         (OVar3 = Instruction::opcode(local_480), OVar3 != OpTypeUntypedPointerKHR))
      goto LAB_00584c1f;
    }
    ValidationState_t::diag
              ((DiagnosticStream *)&base_id,_,SPV_ERROR_INVALID_ID,
               (Instruction *)instr_name.field_2._8_8_);
    pDVar8 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)&base_id,
                        (char (*) [37])"Base type must be a non-pointer type");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&base_id);
  }
LAB_00585624:
  local_274 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateAccessChain(ValidationState_t& _,
                                 const Instruction* inst) {
  std::string instr_name =
      "Op" + std::string(spvOpcodeString(static_cast<spv::Op>(inst->opcode())));

  const bool untyped_pointer = spvOpcodeGeneratesUntypedPointer(inst->opcode());

  // The result type must be OpTypePointer for regular access chains and an
  // OpTypeUntypedPointerKHR for untyped access chains.
  auto result_type = _.FindDef(inst->type_id());
  if (untyped_pointer) {
    if (!result_type ||
        spv::Op::OpTypeUntypedPointerKHR != result_type->opcode()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "The Result Type of " << instr_name << " <id> "
             << _.getIdName(inst->id())
             << " must be OpTypeUntypedPointerKHR. Found Op"
             << spvOpcodeString(static_cast<spv::Op>(result_type->opcode()))
             << ".";
    }
  } else {
    if (!result_type || spv::Op::OpTypePointer != result_type->opcode()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "The Result Type of " << instr_name << " <id> "
             << _.getIdName(inst->id()) << " must be OpTypePointer. Found Op"
             << spvOpcodeString(static_cast<spv::Op>(result_type->opcode()))
             << ".";
    }
  }

  if (untyped_pointer) {
    // Base type must be a non-pointer type.
    const auto base_type = _.FindDef(inst->GetOperandAs<uint32_t>(2));
    if (!base_type || !spvOpcodeGeneratesType(base_type->opcode()) ||
        base_type->opcode() == spv::Op::OpTypePointer ||
        base_type->opcode() == spv::Op::OpTypeUntypedPointerKHR) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Base type must be a non-pointer type";
    }
  }

  // Base must be a pointer, pointing to the base of a composite object.
  const auto base_index = untyped_pointer ? 3 : 2;
  const auto base_id = inst->GetOperandAs<uint32_t>(base_index);
  const auto base = _.FindDef(base_id);
  const auto base_type = _.FindDef(base->type_id());
  if (!base_type || !(spv::Op::OpTypePointer == base_type->opcode() ||
                      (untyped_pointer && spv::Op::OpTypeUntypedPointerKHR ==
                                              base_type->opcode()))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "The Base <id> " << _.getIdName(base_id) << " in " << instr_name
           << " instruction must be a pointer.";
  }

  // The result pointer storage class and base pointer storage class must match.
  // Word 2 of OpTypePointer is the Storage Class.
  auto result_type_storage_class = result_type->word(2);
  auto base_type_storage_class = base_type->word(2);
  if (result_type_storage_class != base_type_storage_class) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "The result pointer storage class and base "
              "pointer storage class in "
           << instr_name << " do not match.";
  }

  // The type pointed to by OpTypePointer (word 3) must be a composite type.
  auto type_pointee = untyped_pointer
                          ? _.FindDef(inst->GetOperandAs<uint32_t>(2))
                          : _.FindDef(base_type->word(3));

  // Check Universal Limit (SPIR-V Spec. Section 2.17).
  // The number of indexes passed to OpAccessChain may not exceed 255
  // The instruction includes 4 words + N words (for N indexes)
  size_t num_indexes = inst->words().size() - 4;
  if (inst->opcode() == spv::Op::OpPtrAccessChain ||
      inst->opcode() == spv::Op::OpInBoundsPtrAccessChain ||
      inst->opcode() == spv::Op::OpUntypedPtrAccessChainKHR ||
      inst->opcode() == spv::Op::OpUntypedInBoundsPtrAccessChainKHR) {
    // In pointer access chains, the element operand is required, but not
    // counted as an index.
    --num_indexes;
  }
  const size_t num_indexes_limit =
      _.options()->universal_limits_.max_access_chain_indexes;
  if (num_indexes > num_indexes_limit) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "The number of indexes in " << instr_name << " may not exceed "
           << num_indexes_limit << ". Found " << num_indexes << " indexes.";
  }
  // Indexes walk the type hierarchy to the desired depth, potentially down to
  // scalar granularity. The first index in Indexes will select the top-level
  // member/element/component/element of the base composite. All composite
  // constituents use zero-based numbering, as described by their OpType...
  // instruction. The second index will apply similarly to that result, and so
  // on. Once any non-composite type is reached, there must be no remaining
  // (unused) indexes.
  auto starting_index = untyped_pointer ? 5 : 4;
  if (inst->opcode() == spv::Op::OpPtrAccessChain ||
      inst->opcode() == spv::Op::OpInBoundsPtrAccessChain ||
      inst->opcode() == spv::Op::OpUntypedPtrAccessChainKHR ||
      inst->opcode() == spv::Op::OpUntypedInBoundsPtrAccessChainKHR) {
    ++starting_index;
  }
  for (size_t i = starting_index; i < inst->words().size(); ++i) {
    const uint32_t cur_word = inst->words()[i];
    // Earlier ID checks ensure that cur_word definition exists.
    auto cur_word_instr = _.FindDef(cur_word);
    // The index must be a scalar integer type (See OpAccessChain in the Spec.)
    auto index_type = _.FindDef(cur_word_instr->type_id());
    if (!index_type || spv::Op::OpTypeInt != index_type->opcode()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Indexes passed to " << instr_name
             << " must be of type integer.";
    }
    switch (type_pointee->opcode()) {
      case spv::Op::OpTypeMatrix:
      case spv::Op::OpTypeVector:
      case spv::Op::OpTypeCooperativeMatrixNV:
      case spv::Op::OpTypeCooperativeMatrixKHR:
      case spv::Op::OpTypeArray:
      case spv::Op::OpTypeRuntimeArray: {
        // In OpTypeMatrix, OpTypeVector, spv::Op::OpTypeCooperativeMatrixNV,
        // OpTypeArray, and OpTypeRuntimeArray, word 2 is the Element Type.
        type_pointee = _.FindDef(type_pointee->word(2));
        break;
      }
      case spv::Op::OpTypeStruct: {
        // In case of structures, there is an additional constraint on the
        // index: the index must be an OpConstant.
        int64_t cur_index;
        if (!_.EvalConstantValInt64(cur_word, &cur_index)) {
          return _.diag(SPV_ERROR_INVALID_ID, cur_word_instr)
                 << "The <id> passed to " << instr_name
                 << " to index into a "
                    "structure must be an OpConstant.";
        }

        // The index points to the struct member we want, therefore, the index
        // should be less than the number of struct members.
        const int64_t num_struct_members =
            static_cast<int64_t>(type_pointee->words().size() - 2);
        if (cur_index >= num_struct_members || cur_index < 0) {
          return _.diag(SPV_ERROR_INVALID_ID, cur_word_instr)
                 << "Index is out of bounds: " << instr_name
                 << " cannot find index " << cur_index
                 << " into the structure <id> "
                 << _.getIdName(type_pointee->id()) << ". This structure has "
                 << num_struct_members << " members. Largest valid index is "
                 << num_struct_members - 1 << ".";
        }
        // Struct members IDs start at word 2 of OpTypeStruct.
        const size_t word_index = static_cast<size_t>(cur_index) + 2;
        auto structMemberId = type_pointee->word(word_index);
        type_pointee = _.FindDef(structMemberId);
        break;
      }
      default: {
        // Give an error. reached non-composite type while indexes still remain.
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << instr_name
               << " reached non-composite type while indexes "
                  "still remain to be traversed.";
      }
    }
  }

  if (!untyped_pointer) {
    // Result type is a pointer. Find out what it's pointing to.
    // This will be used to make sure the indexing results in the same type.
    // OpTypePointer word 3 is the type being pointed to.
    const auto result_type_pointee = _.FindDef(result_type->word(3));
    // At this point, we have fully walked down from the base using the indeces.
    // The type being pointed to should be the same as the result type.
    if (type_pointee->id() != result_type_pointee->id()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << instr_name << " result type (Op"
             << spvOpcodeString(
                    static_cast<spv::Op>(result_type_pointee->opcode()))
             << ") does not match the type that results from indexing into the "
                "base "
                "<id> (Op"
             << spvOpcodeString(static_cast<spv::Op>(type_pointee->opcode()))
             << ").";
    }
  }

  return SPV_SUCCESS;
}